

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEnumerated.c
# Opt level: O0

asn_dec_rval_t
NativeEnumerated_decode_uper
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  int32_t iVar1;
  ssize_t sVar2;
  long *in_RCX;
  uint *in_RDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  asn_dec_rval_t aVar3;
  int inext;
  long value;
  asn_per_constraint_t *ct;
  long *native;
  asn_dec_rval_t rval;
  asn_INTEGER_specifics_t *specs;
  asn_dec_rval_t tmp_error;
  asn_per_data_t *in_stack_ffffffffffffff48;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  int local_94;
  char *local_88;
  char *local_80;
  char *local_78;
  long local_68;
  uint *local_60;
  undefined8 *local_58;
  ulong local_50;
  size_t local_48;
  long *local_40;
  long *local_30;
  uint *local_28;
  undefined8 *local_20;
  int nbits;
  asn_per_data_t *in_stack_fffffffffffffff0;
  ulong uVar4;
  size_t local_8;
  
  nbits = (int)((ulong)in_RDI >> 0x20);
  local_40 = (long *)in_RSI[0x13];
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  memset(&local_50,0,0x10);
  local_58 = (undefined8 *)*local_30;
  if (local_28 == (uint *)0x0) {
    if (local_20[0x10] == 0) {
      uVar4 = 2;
      local_8 = 0;
      if (local_20 == (undefined8 *)0x0) {
        local_78 = "";
      }
      else {
        local_78 = (char *)*local_20;
      }
      ASN_DEBUG("Failed to decode element %s",local_78);
      goto LAB_0015278d;
    }
    local_60 = (uint *)local_20[0x10];
  }
  else {
    local_60 = local_28;
  }
  if (local_40 == (long *)0x0) {
    uVar4 = 2;
    local_8 = 0;
    if (local_20 == (undefined8 *)0x0) {
      local_80 = "";
    }
    else {
      local_80 = (char *)*local_20;
    }
    ASN_DEBUG("Failed to decode element %s",local_80);
    goto LAB_0015278d;
  }
  if (local_58 == (undefined8 *)0x0) {
    local_58 = (undefined8 *)calloc(1,8);
    *local_30 = (long)local_58;
    if (local_58 == (undefined8 *)0x0) {
      uVar4 = 2;
      local_8 = 0;
      if (local_20 == (undefined8 *)0x0) {
        local_88 = "";
      }
      else {
        local_88 = (char *)*local_20;
      }
      ASN_DEBUG("Failed to decode element %s",local_88);
      goto LAB_0015278d;
    }
  }
  ASN_DEBUG("Decoding %s as NativeEnumerated",*local_20);
  if ((*local_60 & 4) != 0) {
    iVar1 = per_get_few_bits(in_stack_fffffffffffffff0,nbits);
    if (iVar1 < 0) {
      local_8 = 0;
      uVar4 = 1;
      goto LAB_0015278d;
    }
    if (iVar1 != 0) {
      local_60 = (uint *)0x0;
    }
  }
  if ((local_60 == (uint *)0x0) || ((int)local_60[1] < 0)) {
    if (*(int *)((long)local_40 + 0x14) == 0) {
      uVar4 = 2;
      local_8 = 0;
      if (local_20 == (undefined8 *)0x0) {
        local_a8 = "";
      }
      else {
        local_a8 = (char *)*local_20;
      }
      ASN_DEBUG("Failed to decode element %s",local_a8);
      goto LAB_0015278d;
    }
    sVar2 = uper_get_nsnnwn(in_stack_ffffffffffffff48);
    if (sVar2 < 0) {
      uVar4 = 1;
      local_8 = 0;
      goto LAB_0015278d;
    }
    local_68 = (*(int *)((long)local_40 + 0x14) + -1) + sVar2;
    if ((int)local_40[2] <= local_68) {
      uVar4 = 2;
      local_8 = 0;
      if (local_20 == (undefined8 *)0x0) {
        local_b0 = "";
      }
      else {
        local_b0 = (char *)*local_20;
      }
      ASN_DEBUG("Failed to decode element %s",local_b0);
      goto LAB_0015278d;
    }
  }
  else {
    iVar1 = per_get_few_bits(in_stack_fffffffffffffff0,nbits);
    local_68 = (long)iVar1;
    if (local_68 < 0) {
      local_8 = 0;
      uVar4 = 1;
      goto LAB_0015278d;
    }
    if (*(int *)((long)local_40 + 0x14) == 0) {
      local_94 = (int)local_40[2];
    }
    else {
      local_94 = *(int *)((long)local_40 + 0x14) + -1;
    }
    if (local_94 <= local_68) {
      uVar4 = 2;
      local_8 = 0;
      if (local_20 == (undefined8 *)0x0) {
        local_a0 = "";
      }
      else {
        local_a0 = (char *)*local_20;
      }
      ASN_DEBUG("Failed to decode element %s",local_a0);
      goto LAB_0015278d;
    }
  }
  *local_58 = *(undefined8 *)(*local_40 + local_68 * 0x18);
  ASN_DEBUG("Decoded %s = %ld",*local_20,*local_58);
  local_8 = local_48;
  uVar4 = local_50;
LAB_0015278d:
  aVar3._0_8_ = uVar4 & 0xffffffff;
  aVar3.consumed = local_8;
  return aVar3;
}

Assistant:

asn_dec_rval_t
NativeEnumerated_decode_uper(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td, asn_per_constraints_t *constraints,
	void **sptr, asn_per_data_t *pd) {
	asn_INTEGER_specifics_t *specs = (asn_INTEGER_specifics_t *)td->specifics;
	asn_dec_rval_t rval = { RC_OK, 0 };
	long *native = (long *)*sptr;
	asn_per_constraint_t *ct;
	long value;

	(void)opt_codec_ctx;

	if(constraints) ct = &constraints->value;
	else if(td->per_constraints) ct = &td->per_constraints->value;
	else ASN__DECODE_FAILED;	/* Mandatory! */
	if(!specs) ASN__DECODE_FAILED;

	if(!native) {
		native = (long *)(*sptr = CALLOC(1, sizeof(*native)));
		if(!native) ASN__DECODE_FAILED;
	}

	ASN_DEBUG("Decoding %s as NativeEnumerated", td->name);

	if(ct->flags & APC_EXTENSIBLE) {
		int inext = per_get_few_bits(pd, 1);
		if(inext < 0) ASN__DECODE_STARVED;
		if(inext) ct = 0;
	}

	if(ct && ct->range_bits >= 0) {
		value = per_get_few_bits(pd, ct->range_bits);
		if(value < 0) ASN__DECODE_STARVED;
		if(value >= (specs->extension
			? specs->extension - 1 : specs->map_count))
			ASN__DECODE_FAILED;
	} else {
		if(!specs->extension)
			ASN__DECODE_FAILED;
		/*
		 * X.691, #10.6: normally small non-negative whole number;
		 */
		value = uper_get_nsnnwn(pd);
		if(value < 0) ASN__DECODE_STARVED;
		value += specs->extension - 1;
		if(value >= specs->map_count)
			ASN__DECODE_FAILED;
	}

	*native = specs->value2enum[value].nat_value;
	ASN_DEBUG("Decoded %s = %ld", td->name, *native);

	return rval;
}